

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi64 iValue;
  int res;
  sxi64 iCount;
  int bRecursive;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  iCount._4_4_ = 0;
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_array(*apArg);
    if (iVar1 == 0) {
      iVar1 = jx9_value_is_null(*apArg);
      jx9_result_int(pCtx,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    }
    else {
      if (1 < nArg) {
        iVar1 = jx9_value_to_int(apArg[1]);
        iCount._4_4_ = (uint)(iVar1 == 1);
      }
      iValue = HashmapCount((jx9_hashmap *)((*apArg)->x).pOther,iCount._4_4_,0);
      jx9_result_int64(pCtx,iValue);
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bRecursive = FALSE;
	sxi64 iCount;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* TICKET 1433-19: Handle objects */
		int res = !jx9_value_is_null(apArg[0]);
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	if( nArg > 1 ){
		/* Recursive count? */
		bRecursive = jx9_value_to_int(apArg[1]) == 1 /* COUNT_RECURSIVE */;
	}
	/* Count */
	iCount = HashmapCount((jx9_hashmap *)apArg[0]->x.pOther, bRecursive, 0);
	jx9_result_int64(pCtx, iCount);
	return JX9_OK;
}